

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

int LiteScript::Syntax::ReadReturn
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  bool bVar1;
  uint uVar2;
  Instruction local_98;
  Instruction local_88;
  int local_74;
  undefined1 local_70 [4];
  int tmp;
  int local_5c;
  undefined4 local_58;
  int i;
  string local_48 [8];
  string keyword;
  ErrorType *errorType_local;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl_local;
  char *text_local;
  
  std::__cxx11::string::string(local_48);
  uVar2 = ReadName(text,(string *)local_48);
  if (uVar2 != 0) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"return");
    if (!bVar1) {
      local_5c = 6;
      uVar2 = ReadWhitespace(text + 6);
      local_5c = uVar2 + local_5c;
      if (text[local_5c] == ';') {
        Instruction::Instruction((Instruction *)local_70,INSTR_RETURN);
        std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                  (instrl,(value_type *)local_70);
        Instruction::~Instruction((Instruction *)local_70);
        text_local._4_4_ = local_5c + 1;
      }
      else {
        local_74 = ReadExpression(text + local_5c,instrl,errorType);
        if (local_74 < 1) {
          if (local_74 == 0) {
            *errorType = SCRPT_ERROR_RETURN;
            text_local._4_4_ = -local_5c;
          }
          else {
            text_local._4_4_ = local_74 - local_5c;
          }
        }
        else {
          local_5c = local_5c + local_74;
          uVar2 = ReadWhitespace(text + local_5c);
          local_5c = local_5c + uVar2;
          Instruction::Instruction(&local_88,INSTR_DEFINE_RETURN);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                    (instrl,&local_88);
          Instruction::~Instruction(&local_88);
          Instruction::Instruction(&local_98,INSTR_RETURN);
          std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
                    (instrl,&local_98);
          Instruction::~Instruction(&local_98);
          if (text[local_5c] == ';') {
            text_local._4_4_ = local_5c + 1;
          }
          else {
            *errorType = SCRPT_ERROR_SEMICOLON;
            text_local._4_4_ = -local_5c;
          }
        }
      }
      goto LAB_00173453;
    }
  }
  text_local._4_4_ = 0;
LAB_00173453:
  local_58 = 1;
  std::__cxx11::string::~string(local_48);
  return text_local._4_4_;
}

Assistant:

int LiteScript::Syntax::ReadReturn(const char *text, std::vector<Instruction> &instrl, Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "return")
        return 0;
    int i = 6;
    i += (int)ReadWhitespace(text + i);
    if (text[i] == ';') {
        instrl.push_back(Instruction(InstrCode::INSTR_RETURN));
        return i + 1;
    }
    int tmp;
    if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
        if (tmp != 0)
            return tmp - i;
        else {
            errorType = Script::ErrorType::SCRPT_ERROR_RETURN;
            return -i;
        }
    }
    i += tmp;
    i += (int)ReadWhitespace(text + i);
    instrl.push_back(Instruction(InstrCode::INSTR_DEFINE_RETURN));
    instrl.push_back(Instruction(InstrCode::INSTR_RETURN));
    if (text[i] != ';') {
        errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
        return -i;
    }
    return i + 1;
}